

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O3

void llvm::object_deleter<(anonymous_namespace)::FilesToRemoveCleanup>::call(void *Ptr)

{
  FileToRemoveList *this;
  
  this = (anonymous_namespace)::FilesToRemove;
  if (Ptr != (void *)0x0) {
    LOCK();
    (anonymous_namespace)::FilesToRemove = (FileToRemoveList *)0x0;
    UNLOCK();
    if (this != (FileToRemoveList *)0x0) {
      anon_unknown.dwarf_2e84d7::FileToRemoveList::~FileToRemoveList(this);
      operator_delete(this,0x10);
    }
  }
  operator_delete(Ptr,1);
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }